

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_avx2.c
# Opt level: O0

uint aom_variance128x64_avx2(uint8_t *src,int src_stride,uint8_t *ref,int ref_stride,uint *sse)

{
  undefined1 auVar1 [32];
  __m256i val;
  __m256i sum_00;
  __m128i vsum_00;
  __m256i vsse_00;
  undefined1 auVar2 [32];
  int iVar3;
  int *in_R8;
  int sum;
  __m128i vsum_128;
  __m256i vsum16;
  int i;
  __m256i vsum;
  __m256i vsse;
  undefined1 *in_stack_fffffffffffffe20;
  __m256i *in_stack_fffffffffffffe28;
  __m256i *in_stack_fffffffffffffe30;
  int in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe3c;
  uint8_t *in_stack_fffffffffffffe40;
  undefined8 in_stack_fffffffffffffe48;
  uint8_t *in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe60 [12];
  undefined4 in_stack_fffffffffffffe6c;
  longlong in_stack_fffffffffffffe70;
  uint *in_stack_fffffffffffffe80;
  uint *puVar4;
  longlong in_stack_fffffffffffffe88;
  longlong lVar5;
  longlong in_stack_fffffffffffffe90;
  longlong lVar6;
  longlong in_stack_fffffffffffffe98;
  longlong lVar7;
  undefined1 in_stack_fffffffffffffea0 [24];
  int local_144;
  undefined1 local_140 [24];
  undefined8 uStack_128;
  
  _local_140 = ZEXT1632(ZEXT816(0));
  for (local_144 = 0; local_144 < 4; local_144 = local_144 + 1) {
    in_stack_fffffffffffffe20 = &stack0xfffffffffffffe80;
    variance128_avx2(in_stack_fffffffffffffe50,(int)((ulong)in_stack_fffffffffffffe48 >> 0x20),
                     in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38,
                     in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    sum_00._8_12_ = in_stack_fffffffffffffe60;
    sum_00[0] = uStack_128;
    sum_00[2]._4_4_ = in_stack_fffffffffffffe6c;
    sum_00[3] = in_stack_fffffffffffffe70;
    puVar4 = in_stack_fffffffffffffe80;
    lVar5 = in_stack_fffffffffffffe88;
    lVar6 = in_stack_fffffffffffffe90;
    lVar7 = in_stack_fffffffffffffe98;
    sum_to_32bit_avx2(sum_00);
    auVar2._8_8_ = local_140._8_8_;
    auVar2._0_8_ = local_140._0_8_;
    auVar2._16_8_ = local_140._16_8_;
    auVar2._24_8_ = uStack_128;
    auVar1._8_8_ = in_stack_fffffffffffffe88;
    auVar1._0_8_ = in_stack_fffffffffffffe80;
    auVar1._16_8_ = in_stack_fffffffffffffe90;
    auVar1._24_8_ = in_stack_fffffffffffffe98;
    auVar1 = vpaddd_avx2(auVar2,auVar1);
    in_stack_fffffffffffffe40 = (uint8_t *)local_140._0_8_;
    in_stack_fffffffffffffe48 = local_140._8_8_;
    in_stack_fffffffffffffe50 = (uint8_t *)local_140._16_8_;
    in_stack_fffffffffffffe80 = puVar4;
    in_stack_fffffffffffffe88 = lVar5;
    in_stack_fffffffffffffe90 = lVar6;
    in_stack_fffffffffffffe98 = lVar7;
    _local_140 = auVar1;
  }
  val[1] = (longlong)in_stack_fffffffffffffe20;
  val[0] = 0x63243a;
  val[2] = (longlong)in_stack_fffffffffffffe28;
  val[3] = (longlong)in_stack_fffffffffffffe30;
  mm256_add_hi_lo_epi32(val);
  vsse_00[1] = in_stack_fffffffffffffea0._0_8_;
  vsse_00[2] = in_stack_fffffffffffffea0._8_8_;
  vsse_00[3] = in_stack_fffffffffffffea0._16_8_;
  vsse_00[0] = in_stack_fffffffffffffe98;
  vsum_00[1] = in_stack_fffffffffffffe90;
  vsum_00[0] = in_stack_fffffffffffffe88;
  iVar3 = variance_final_from_32bit_sum_avx2(vsse_00,vsum_00,in_stack_fffffffffffffe80);
  return *in_R8 - (int)((long)iVar3 * (long)iVar3 >> 0xd);
}

Assistant:

unsigned int aom_mse16x16_avx2(const uint8_t *src, int src_stride,
                               const uint8_t *ref, int ref_stride,
                               unsigned int *sse) {
  aom_variance16x16_avx2(src, src_stride, ref, ref_stride, sse);
  return *sse;
}